

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O0

void __thiscall
slang::ast::CaseStatement::visitExprs<CollectLHSSymbols&>
          (CaseStatement *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  reference ppEVar2;
  AlwaysFFVisitor *in_RDI;
  Expression *itemExpr;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffb0;
  iterator in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_40;
  reference local_38;
  reference local_30;
  ItemGroup *local_28;
  __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_20;
  optional<slang::SourceLocation> *local_18;
  
  Expression::visit<CollectLHSSymbols&>(in_stack_ffffffffffffffb0,in_RDI);
  local_18 = &in_RDI->errorLocation;
  local_20._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)in_RDI
                 );
  local_28 = (ItemGroup *)
             std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
                       ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                        in_stack_ffffffffffffffb8._M_current);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
               ::operator*(&local_20);
    local_30 = local_38;
    local_40._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
    in_stack_ffffffffffffffb8 =
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                   (in_stack_ffffffffffffffb8._M_current);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_RDI);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppEVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*(&local_40);
      in_stack_ffffffffffffffb0 = *ppEVar2;
      Expression::visit<CollectLHSSymbols&>(in_stack_ffffffffffffffb0,in_RDI);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_40);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto itemExpr : item.expressions)
                itemExpr->visit(visitor);
        }
    }